

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPublicKey.cpp
# Opt level: O1

ByteString * __thiscall EDPublicKey::serialise(ByteString *__return_storage_ptr__,EDPublicKey *this)

{
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_38,&this->ec);
  ByteString::serialise(&local_60,&this->a);
  operator+(__return_storage_ptr__,&local_38,&local_60);
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString EDPublicKey::serialise() const
{
	return ec.serialise() +
	       a.serialise();
}